

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry_sparse.c
# Opt level: O0

void archive_entry_sparse_clear(archive_entry *entry)

{
  undefined8 uVar1;
  long in_RDI;
  ae_sparse *sp;
  
  while (*(long *)(in_RDI + 0x410) != 0) {
    uVar1 = **(undefined8 **)(in_RDI + 0x410);
    free(*(void **)(in_RDI + 0x410));
    *(undefined8 *)(in_RDI + 0x410) = uVar1;
  }
  *(undefined8 *)(in_RDI + 0x418) = 0;
  return;
}

Assistant:

void
archive_entry_sparse_clear(struct archive_entry *entry)
{
	struct ae_sparse *sp;

	while (entry->sparse_head != NULL) {
		sp = entry->sparse_head->next;
		free(entry->sparse_head);
		entry->sparse_head = sp;
	}
	entry->sparse_tail = NULL;
}